

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall notch::io::NetSpec::NetSpec(NetSpec *this,Net *net)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *layer_00;
  element_type *layer_01;
  LayerSpec local_110;
  undefined1 local_b0 [8];
  shared_ptr<const_notch::core::ALossLayer> lossLayer;
  LayerSpec spec;
  shared_ptr<const_notch::core::ABackpropLayer> layer;
  size_t i;
  Net *net_local;
  NetSpec *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->inputDim = 0;
  this->outputDim = 0;
  core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::vector
            (&this->layers);
  this->hasLoss = false;
  std::__cxx11::string::operator=((string *)this,"Net");
  for (layer.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)core::Net::size(net),
      layer.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi < p_Var2;
      layer.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(layer.
                    super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
    core::Net::getLayer((Net *)&spec.bias.
                                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(size_t)net);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &spec.bias.
                        super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      layer_00 = core::std::
                 __shared_ptr_access<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&spec.bias.
                                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      LayerSpec::LayerSpec
                ((LayerSpec *)
                 &lossLayer.
                  super___shared_ptr<const_notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,layer_00);
      core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::push_back
                (&this->layers,
                 (value_type *)
                 &lossLayer.
                  super___shared_ptr<const_notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (layer.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this->inputDim = spec._24_8_;
      }
      this->outputDim = spec.inputDim;
      LayerSpec::~LayerSpec
                ((LayerSpec *)
                 &lossLayer.
                  super___shared_ptr<const_notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    core::std::shared_ptr<const_notch::core::ABackpropLayer>::~shared_ptr
              ((shared_ptr<const_notch::core::ABackpropLayer> *)
               &spec.bias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  core::Net::getLossLayer((Net *)local_b0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b0);
  if (bVar1) {
    layer_01 = core::std::
               __shared_ptr_access<const_notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<const_notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_b0);
    LayerSpec::LayerSpec(&local_110,layer_01);
    core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::push_back
              (&this->layers,&local_110);
    LayerSpec::~LayerSpec(&local_110);
    this->hasLoss = true;
  }
  core::std::shared_ptr<const_notch::core::ALossLayer>::~shared_ptr
            ((shared_ptr<const_notch::core::ALossLayer> *)local_b0);
  return;
}

Assistant:

NetSpec(const Net &net) {
        this->tag = "Net";
        for (size_t i = 0; i < net.size(); ++i) {
            auto layer = net.getLayer(i);
            if (layer) {
                auto spec = LayerSpec(*layer);
                layers.push_back(spec);
                if (i == 0) {
                    inputDim = spec.inputDim;
                }
                outputDim =spec.outputDim;
            }
        }
        auto lossLayer = net.getLossLayer();
        if (lossLayer) {
            layers.push_back(LayerSpec(*lossLayer));
            hasLoss = true;
        }
    }